

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallCxxModuleBmiGenerator::GenerateScriptForConfig
          (cmInstallCxxModuleBmiGenerator *this,ostream *os,string *config,Indent indent)

{
  ulong uVar1;
  ostream *poVar2;
  WrapQuotes in_R8D;
  bool bVar3;
  undefined1 auVar4 [16];
  string_view str;
  string local_88;
  int local_58;
  uint local_54;
  string local_50;
  string *local_30;
  string *loc;
  string *config_local;
  ostream *os_local;
  cmInstallCxxModuleBmiGenerator *this_local;
  Indent indent_local;
  
  loc = config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  GetScriptLocation(&local_50,this,config);
  local_30 = &local_50;
  uVar1 = std::__cxx11::string::empty();
  bVar3 = (uVar1 & 1) != 0;
  if (!bVar3) {
    local_58 = this_local._4_4_;
    poVar2 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar2 = std::operator<<(poVar2,"include(\"");
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    str._M_len = auVar4._8_8_;
    str._M_str = (char *)0x1;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_88,auVar4._0_8_,str,in_R8D);
    poVar2 = std::operator<<(poVar2,(string *)&local_88);
    std::operator<<(poVar2,"\" OPTIONAL)\n");
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_54 = (uint)bVar3;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmInstallCxxModuleBmiGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto const& loc = this->GetScriptLocation(config);
  if (loc.empty()) {
    return;
  }
  os << indent << "include(\""
     << cmOutputConverter::EscapeForCMake(
          loc, cmOutputConverter::WrapQuotes::NoWrap)
     << "\" OPTIONAL)\n";
}